

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

void nni_listener_close(nni_listener *l)

{
  nni_mtx_lock(&listeners_lk);
  if (l->l_closed == true) {
    nni_mtx_unlock(&listeners_lk);
  }
  else {
    l->l_closed = true;
    nni_id_remove(&listeners,(ulong)l->l_id);
    nni_mtx_unlock(&listeners_lk);
    nni_listener_shutdown(l);
    nni_sock_remove_listener(l);
  }
  nni_listener_rele(l);
  return;
}

Assistant:

void
nni_listener_close(nni_listener *l)
{
	nni_mtx_lock(&listeners_lk);
	if (l->l_closed) {
		nni_mtx_unlock(&listeners_lk);
		nni_listener_rele(l);
		return;
	}
	l->l_closed = true;
	nni_id_remove(&listeners, l->l_id);
	nni_mtx_unlock(&listeners_lk);

	nni_listener_shutdown(l);

	nni_sock_remove_listener(l);
	nni_listener_rele(l); // This will reap if reference count is zero.
}